

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O0

void __thiscall
glslang::HlslParseContext::transferTypeAttributes
          (HlslParseContext *this,TSourceLoc *loc,TAttributes *attributes,TType *type,
          bool allowEntry)

{
  undefined4 uVar1;
  bool bVar2;
  int iVar3;
  size_type sVar4;
  pointer pTVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  undefined4 extraout_var_20;
  undefined4 extraout_var_21;
  undefined4 extraout_var_22;
  undefined4 extraout_var_23;
  undefined4 extraout_var_24;
  undefined4 extraout_var_25;
  undefined4 extraout_var_26;
  undefined4 extraout_var_27;
  undefined4 extraout_var_28;
  undefined4 extraout_var_29;
  undefined4 extraout_var_30;
  undefined4 extraout_var_31;
  undefined4 extraout_var_32;
  undefined4 extraout_var_33;
  undefined4 extraout_var_34;
  undefined4 extraout_var_35;
  undefined4 extraout_var_36;
  undefined4 extraout_var_37;
  undefined4 extraout_var_38;
  undefined4 extraout_var_39;
  undefined4 extraout_var_40;
  undefined4 extraout_var_41;
  undefined4 extraout_var_42;
  undefined4 extraout_var_43;
  undefined4 extraout_var_44;
  undefined4 extraout_var_45;
  undefined4 extraout_var_46;
  undefined4 extraout_var_47;
  undefined4 extraout_var_48;
  undefined4 extraout_var_49;
  EVP_PKEY_CTX *ctx;
  undefined1 local_80 [8];
  TSourceLoc loc_1;
  _Self local_60;
  const_iterator it;
  TString builtInString;
  int value;
  bool allowEntry_local;
  TType *type_local;
  TAttributes *attributes_local;
  TSourceLoc *loc_local;
  HlslParseContext *this_local;
  
  builtInString.field_2._M_local_buf[0xf] = allowEntry;
  sVar4 = std::__cxx11::
          list<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>::size
                    (&attributes->
                      super_list<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>
                    );
  if (sVar4 != 0) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    basic_string((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)&it);
    local_60._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>::begin
                   (&attributes->
                     super_list<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>
                   );
    while( true ) {
      loc_1._16_8_ = std::__cxx11::
                     list<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>
                     ::end(&attributes->
                            super_list<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>
                          );
      bVar2 = std::operator!=(&local_60,(_Self *)&loc_1.column);
      if (!bVar2) break;
      pTVar5 = std::_List_const_iterator<glslang::TAttributeArgs>::operator->(&local_60);
      switch(pTVar5->name) {
      case EatBinding:
        pTVar5 = std::_List_const_iterator<glslang::TAttributeArgs>::operator->(&local_60);
        bVar2 = TAttributeArgs::getInt(pTVar5,(int *)(builtInString.field_2._M_local_buf + 8),0);
        uVar1 = builtInString.field_2._8_4_;
        if (bVar2) {
          iVar3 = (*type->_vptr_TType[10])();
          *(ulong *)(CONCAT44(extraout_var_00,iVar3) + 0x1c) =
               *(ulong *)(CONCAT44(extraout_var_00,iVar3) + 0x1c) & 0xffff0000ffffffff |
               ((ulong)(uint)uVar1 & 0xffff) << 0x20;
          iVar3 = (*type->_vptr_TType[10])();
          *(ulong *)(CONCAT44(extraout_var_01,iVar3) + 0x1c) =
               *(ulong *)(CONCAT44(extraout_var_01,iVar3) + 0x1c) & 0xffffffffffc07fff;
        }
        else {
          (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                    (this,loc,"needs a literal integer","binding","");
        }
        pTVar5 = std::_List_const_iterator<glslang::TAttributeArgs>::operator->(&local_60);
        bVar2 = TAttributeArgs::getInt(pTVar5,(int *)(builtInString.field_2._M_local_buf + 8),1);
        uVar1 = builtInString.field_2._8_4_;
        if (bVar2) {
          iVar3 = (*type->_vptr_TType[10])();
          *(ulong *)(CONCAT44(extraout_var_02,iVar3) + 0x1c) =
               *(ulong *)(CONCAT44(extraout_var_02,iVar3) + 0x1c) & 0xffffffffffc07fff |
               ((ulong)(uint)uVar1 & 0x7f) << 0xf;
        }
        break;
      case EatGlobalBinding:
        pTVar5 = std::_List_const_iterator<glslang::TAttributeArgs>::operator->(&local_60);
        bVar2 = TAttributeArgs::getInt(pTVar5,(int *)(builtInString.field_2._M_local_buf + 8),0);
        if (bVar2) {
          (this->super_TParseContextBase).globalUniformBinding = builtInString.field_2._8_4_;
        }
        else {
          (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                    (this,loc,"needs a literal integer","global binding","");
        }
        pTVar5 = std::_List_const_iterator<glslang::TAttributeArgs>::operator->(&local_60);
        bVar2 = TAttributeArgs::getInt(pTVar5,(int *)(builtInString.field_2._M_local_buf + 8),1);
        if (bVar2) {
          (this->super_TParseContextBase).globalUniformSet = builtInString.field_2._8_4_;
        }
        break;
      case EatLocation:
        pTVar5 = std::_List_const_iterator<glslang::TAttributeArgs>::operator->(&local_60);
        bVar2 = TAttributeArgs::getInt(pTVar5,(int *)(builtInString.field_2._M_local_buf + 8),0);
        uVar1 = builtInString.field_2._8_4_;
        if (bVar2) {
          iVar3 = (*type->_vptr_TType[10])();
          *(ulong *)(CONCAT44(extraout_var,iVar3) + 0x1c) =
               *(ulong *)(CONCAT44(extraout_var,iVar3) + 0x1c) & 0xfffffffffffff000 |
               (ulong)(uint)uVar1 & 0xfff;
        }
        else {
          (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                    (this,loc,"needs a literal integer","location","");
        }
        break;
      case EatInputAttachment:
        pTVar5 = std::_List_const_iterator<glslang::TAttributeArgs>::operator->(&local_60);
        bVar2 = TAttributeArgs::getInt(pTVar5,(int *)(builtInString.field_2._M_local_buf + 8),0);
        uVar1 = builtInString.field_2._8_4_;
        if (bVar2) {
          iVar3 = (*type->_vptr_TType[10])();
          *(ulong *)(CONCAT44(extraout_var_03,iVar3) + 0x24) =
               *(ulong *)(CONCAT44(extraout_var_03,iVar3) + 0x24) & 0xffffff00ffffffff |
               ((ulong)(uint)uVar1 & 0xff) << 0x20;
        }
        else {
          (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                    (this,loc,"needs a literal integer","input attachment","");
        }
        break;
      case EatBuiltIn:
        pTVar5 = std::_List_const_iterator<glslang::TAttributeArgs>::operator->(&local_60);
        bVar2 = TAttributeArgs::getString(pTVar5,(TString *)&it,0,false);
        if ((bVar2) &&
           (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                     *)&it,"PointSize"), bVar2)) {
          iVar3 = (*type->_vptr_TType[10])();
          *(ulong *)(CONCAT44(extraout_var_04,iVar3) + 8) =
               *(ulong *)(CONCAT44(extraout_var_04,iVar3) + 8) & 0xffffffffffff007f | 0xf80;
        }
        break;
      case EatPushConstant:
        iVar3 = (*type->_vptr_TType[10])();
        *(undefined1 *)(CONCAT44(extraout_var_05,iVar3) + 0x2d) = 1;
        break;
      case EatConstantId:
        iVar3 = (*type->_vptr_TType[10])();
        if (((uint)*(undefined8 *)(CONCAT44(extraout_var_06,iVar3) + 8) & 0x7f) == 2) {
          pTVar5 = std::_List_const_iterator<glslang::TAttributeArgs>::operator->(&local_60);
          ctx = (EVP_PKEY_CTX *)(builtInString.field_2._M_local_buf + 8);
          bVar2 = TAttributeArgs::getInt(pTVar5,(int *)ctx,0);
          if (bVar2) {
            TSourceLoc::init((TSourceLoc *)local_80,ctx);
            iVar3 = (*type->_vptr_TType[10])();
            setSpecConstantId(this,(TSourceLoc *)local_80,
                              (TQualifier *)CONCAT44(extraout_var_07,iVar3),
                              builtInString.field_2._8_4_);
          }
        }
        else {
          (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                    (this,loc,"needs a const type","constant_id","");
        }
        break;
      default:
        if ((builtInString.field_2._M_local_buf[0xf] & 1U) == 0) {
          (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2e])
                    (this,loc,"attribute does not apply to a type","");
        }
        break;
      case EatFormatRgba32f:
        iVar3 = (*type->_vptr_TType[10])();
        *(undefined1 *)(CONCAT44(extraout_var_08,iVar3) + 0x2c) = 1;
        break;
      case EatFormatRgba16f:
        iVar3 = (*type->_vptr_TType[10])();
        *(undefined1 *)(CONCAT44(extraout_var_09,iVar3) + 0x2c) = 2;
        break;
      case EatFormatR32f:
        iVar3 = (*type->_vptr_TType[10])();
        *(undefined1 *)(CONCAT44(extraout_var_10,iVar3) + 0x2c) = 3;
        break;
      case EatFormatRgba8:
        iVar3 = (*type->_vptr_TType[10])();
        *(undefined1 *)(CONCAT44(extraout_var_11,iVar3) + 0x2c) = 4;
        break;
      case EatFormatRgba8Snorm:
        iVar3 = (*type->_vptr_TType[10])();
        *(undefined1 *)(CONCAT44(extraout_var_12,iVar3) + 0x2c) = 5;
        break;
      case EatFormatRg32f:
        iVar3 = (*type->_vptr_TType[10])();
        *(undefined1 *)(CONCAT44(extraout_var_13,iVar3) + 0x2c) = 7;
        break;
      case EatFormatRg16f:
        iVar3 = (*type->_vptr_TType[10])();
        *(undefined1 *)(CONCAT44(extraout_var_14,iVar3) + 0x2c) = 8;
        break;
      case EatFormatR11fG11fB10f:
        iVar3 = (*type->_vptr_TType[10])();
        *(undefined1 *)(CONCAT44(extraout_var_15,iVar3) + 0x2c) = 9;
        break;
      case EatFormatR16f:
        iVar3 = (*type->_vptr_TType[10])();
        *(undefined1 *)(CONCAT44(extraout_var_16,iVar3) + 0x2c) = 10;
        break;
      case EatFormatRgba16:
        iVar3 = (*type->_vptr_TType[10])();
        *(undefined1 *)(CONCAT44(extraout_var_17,iVar3) + 0x2c) = 0xb;
        break;
      case EatFormatRgb10A2:
        iVar3 = (*type->_vptr_TType[10])();
        *(undefined1 *)(CONCAT44(extraout_var_18,iVar3) + 0x2c) = 0xc;
        break;
      case EatFormatRg16:
        iVar3 = (*type->_vptr_TType[10])();
        *(undefined1 *)(CONCAT44(extraout_var_19,iVar3) + 0x2c) = 0xd;
        break;
      case EatFormatRg8:
        iVar3 = (*type->_vptr_TType[10])();
        *(undefined1 *)(CONCAT44(extraout_var_20,iVar3) + 0x2c) = 0xe;
        break;
      case EatFormatR16:
        iVar3 = (*type->_vptr_TType[10])();
        *(undefined1 *)(CONCAT44(extraout_var_21,iVar3) + 0x2c) = 0xf;
        break;
      case EatFormatR8:
        iVar3 = (*type->_vptr_TType[10])();
        *(undefined1 *)(CONCAT44(extraout_var_22,iVar3) + 0x2c) = 0x10;
        break;
      case EatFormatRgba16Snorm:
        iVar3 = (*type->_vptr_TType[10])();
        *(undefined1 *)(CONCAT44(extraout_var_23,iVar3) + 0x2c) = 0x11;
        break;
      case EatFormatRg16Snorm:
        iVar3 = (*type->_vptr_TType[10])();
        *(undefined1 *)(CONCAT44(extraout_var_24,iVar3) + 0x2c) = 0x12;
        break;
      case EatFormatRg8Snorm:
        iVar3 = (*type->_vptr_TType[10])();
        *(undefined1 *)(CONCAT44(extraout_var_25,iVar3) + 0x2c) = 0x13;
        break;
      case EatFormatR16Snorm:
        iVar3 = (*type->_vptr_TType[10])();
        *(undefined1 *)(CONCAT44(extraout_var_26,iVar3) + 0x2c) = 0x14;
        break;
      case EatFormatR8Snorm:
        iVar3 = (*type->_vptr_TType[10])();
        *(undefined1 *)(CONCAT44(extraout_var_27,iVar3) + 0x2c) = 0x15;
        break;
      case EatFormatRgba32i:
        iVar3 = (*type->_vptr_TType[10])();
        *(undefined1 *)(CONCAT44(extraout_var_28,iVar3) + 0x2c) = 0x17;
        break;
      case EatFormatRgba16i:
        iVar3 = (*type->_vptr_TType[10])();
        *(undefined1 *)(CONCAT44(extraout_var_29,iVar3) + 0x2c) = 0x18;
        break;
      case EatFormatRgba8i:
        iVar3 = (*type->_vptr_TType[10])();
        *(undefined1 *)(CONCAT44(extraout_var_30,iVar3) + 0x2c) = 0x19;
        break;
      case EatFormatR32i:
        iVar3 = (*type->_vptr_TType[10])();
        *(undefined1 *)(CONCAT44(extraout_var_31,iVar3) + 0x2c) = 0x1a;
        break;
      case EatFormatRg32i:
        iVar3 = (*type->_vptr_TType[10])();
        *(undefined1 *)(CONCAT44(extraout_var_32,iVar3) + 0x2c) = 0x1c;
        break;
      case EatFormatRg16i:
        iVar3 = (*type->_vptr_TType[10])();
        *(undefined1 *)(CONCAT44(extraout_var_33,iVar3) + 0x2c) = 0x1d;
        break;
      case EatFormatRg8i:
        iVar3 = (*type->_vptr_TType[10])();
        *(undefined1 *)(CONCAT44(extraout_var_34,iVar3) + 0x2c) = 0x1e;
        break;
      case EatFormatR16i:
        iVar3 = (*type->_vptr_TType[10])();
        *(undefined1 *)(CONCAT44(extraout_var_35,iVar3) + 0x2c) = 0x1f;
        break;
      case EatFormatR8i:
        iVar3 = (*type->_vptr_TType[10])();
        *(undefined1 *)(CONCAT44(extraout_var_36,iVar3) + 0x2c) = 0x20;
        break;
      case EatFormatRgba32ui:
        iVar3 = (*type->_vptr_TType[10])();
        *(undefined1 *)(CONCAT44(extraout_var_37,iVar3) + 0x2c) = 0x23;
        break;
      case EatFormatRgba16ui:
        iVar3 = (*type->_vptr_TType[10])();
        *(undefined1 *)(CONCAT44(extraout_var_38,iVar3) + 0x2c) = 0x24;
        break;
      case EatFormatRgba8ui:
        iVar3 = (*type->_vptr_TType[10])();
        *(undefined1 *)(CONCAT44(extraout_var_39,iVar3) + 0x2c) = 0x25;
        break;
      case EatFormatR32ui:
        iVar3 = (*type->_vptr_TType[10])();
        *(undefined1 *)(CONCAT44(extraout_var_40,iVar3) + 0x2c) = 0x26;
        break;
      case EatFormatRgb10a2ui:
        iVar3 = (*type->_vptr_TType[10])();
        *(undefined1 *)(CONCAT44(extraout_var_41,iVar3) + 0x2c) = 0x2a;
        break;
      case EatFormatRg32ui:
        iVar3 = (*type->_vptr_TType[10])();
        *(undefined1 *)(CONCAT44(extraout_var_42,iVar3) + 0x2c) = 0x28;
        break;
      case EatFormatRg16ui:
        iVar3 = (*type->_vptr_TType[10])();
        *(undefined1 *)(CONCAT44(extraout_var_43,iVar3) + 0x2c) = 0x29;
        break;
      case EatFormatRg8ui:
        iVar3 = (*type->_vptr_TType[10])();
        *(undefined1 *)(CONCAT44(extraout_var_44,iVar3) + 0x2c) = 0x2b;
        break;
      case EatFormatR16ui:
        iVar3 = (*type->_vptr_TType[10])();
        *(undefined1 *)(CONCAT44(extraout_var_45,iVar3) + 0x2c) = 0x2c;
        break;
      case EatFormatR8ui:
        iVar3 = (*type->_vptr_TType[10])();
        *(undefined1 *)(CONCAT44(extraout_var_46,iVar3) + 0x2c) = 0x2d;
        break;
      case EatFormatUnknown:
        iVar3 = (*type->_vptr_TType[10])();
        *(undefined1 *)(CONCAT44(extraout_var_47,iVar3) + 0x2c) = 0;
        break;
      case EatNonWritable:
        iVar3 = (*type->_vptr_TType[10])();
        *(ulong *)(CONCAT44(extraout_var_48,iVar3) + 8) =
             *(ulong *)(CONCAT44(extraout_var_48,iVar3) + 8) & 0xffff7fffffffffff | 0x800000000000;
        break;
      case EatNonReadable:
        iVar3 = (*type->_vptr_TType[10])();
        *(ulong *)(CONCAT44(extraout_var_49,iVar3) + 8) =
             *(ulong *)(CONCAT44(extraout_var_49,iVar3) + 8) & 0xfffeffffffffffff | 0x1000000000000;
      }
      std::_List_const_iterator<glslang::TAttributeArgs>::operator++(&local_60);
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    ~basic_string((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)&it)
    ;
  }
  return;
}

Assistant:

void HlslParseContext::transferTypeAttributes(const TSourceLoc& loc, const TAttributes& attributes, TType& type,
    bool allowEntry)
{
    if (attributes.size() == 0)
        return;

    int value;
    TString builtInString;
    for (auto it = attributes.begin(); it != attributes.end(); ++it) {
        switch (it->name) {
        case EatLocation:
            // location
            if (it->getInt(value))
                type.getQualifier().layoutLocation = value;
            else
                error(loc, "needs a literal integer", "location", "");
            break;
        case EatBinding:
            // binding
            if (it->getInt(value)) {
                type.getQualifier().layoutBinding = value;
                type.getQualifier().layoutSet = 0;
            } else
                error(loc, "needs a literal integer", "binding", "");
            // set
            if (it->getInt(value, 1))
                type.getQualifier().layoutSet = value;
            break;
        case EatGlobalBinding:
            // global cbuffer binding
            if (it->getInt(value))
                globalUniformBinding = value;
            else
                error(loc, "needs a literal integer", "global binding", "");
            // global cbuffer set
            if (it->getInt(value, 1))
                globalUniformSet = value;
            break;
        case EatInputAttachment:
            // input attachment
            if (it->getInt(value))
                type.getQualifier().layoutAttachment = value;
            else
                error(loc, "needs a literal integer", "input attachment", "");
            break;
        case EatBuiltIn:
            // PointSize built-in
            if (it->getString(builtInString, 0, false)) {
                if (builtInString == "PointSize")
                    type.getQualifier().builtIn = EbvPointSize;
            }
            break;
        case EatPushConstant:
            // push_constant
            type.getQualifier().layoutPushConstant = true;
            break;
        case EatConstantId:
            // specialization constant
            if (type.getQualifier().storage != EvqConst) {
                error(loc, "needs a const type", "constant_id", "");
                break;
            }
            if (it->getInt(value)) {
                TSourceLoc loc;
                loc.init();
                setSpecConstantId(loc, type.getQualifier(), value);
            }
            break;

        // image formats
        case EatFormatRgba32f:      type.getQualifier().layoutFormat = ElfRgba32f;      break;
        case EatFormatRgba16f:      type.getQualifier().layoutFormat = ElfRgba16f;      break;
        case EatFormatR32f:         type.getQualifier().layoutFormat = ElfR32f;         break;
        case EatFormatRgba8:        type.getQualifier().layoutFormat = ElfRgba8;        break;
        case EatFormatRgba8Snorm:   type.getQualifier().layoutFormat = ElfRgba8Snorm;   break;
        case EatFormatRg32f:        type.getQualifier().layoutFormat = ElfRg32f;        break;
        case EatFormatRg16f:        type.getQualifier().layoutFormat = ElfRg16f;        break;
        case EatFormatR11fG11fB10f: type.getQualifier().layoutFormat = ElfR11fG11fB10f; break;
        case EatFormatR16f:         type.getQualifier().layoutFormat = ElfR16f;         break;
        case EatFormatRgba16:       type.getQualifier().layoutFormat = ElfRgba16;       break;
        case EatFormatRgb10A2:      type.getQualifier().layoutFormat = ElfRgb10A2;      break;
        case EatFormatRg16:         type.getQualifier().layoutFormat = ElfRg16;         break;
        case EatFormatRg8:          type.getQualifier().layoutFormat = ElfRg8;          break;
        case EatFormatR16:          type.getQualifier().layoutFormat = ElfR16;          break;
        case EatFormatR8:           type.getQualifier().layoutFormat = ElfR8;           break;
        case EatFormatRgba16Snorm:  type.getQualifier().layoutFormat = ElfRgba16Snorm;  break;
        case EatFormatRg16Snorm:    type.getQualifier().layoutFormat = ElfRg16Snorm;    break;
        case EatFormatRg8Snorm:     type.getQualifier().layoutFormat = ElfRg8Snorm;     break;
        case EatFormatR16Snorm:     type.getQualifier().layoutFormat = ElfR16Snorm;     break;
        case EatFormatR8Snorm:      type.getQualifier().layoutFormat = ElfR8Snorm;      break;
        case EatFormatRgba32i:      type.getQualifier().layoutFormat = ElfRgba32i;      break;
        case EatFormatRgba16i:      type.getQualifier().layoutFormat = ElfRgba16i;      break;
        case EatFormatRgba8i:       type.getQualifier().layoutFormat = ElfRgba8i;       break;
        case EatFormatR32i:         type.getQualifier().layoutFormat = ElfR32i;         break;
        case EatFormatRg32i:        type.getQualifier().layoutFormat = ElfRg32i;        break;
        case EatFormatRg16i:        type.getQualifier().layoutFormat = ElfRg16i;        break;
        case EatFormatRg8i:         type.getQualifier().layoutFormat = ElfRg8i;         break;
        case EatFormatR16i:         type.getQualifier().layoutFormat = ElfR16i;         break;
        case EatFormatR8i:          type.getQualifier().layoutFormat = ElfR8i;          break;
        case EatFormatRgba32ui:     type.getQualifier().layoutFormat = ElfRgba32ui;     break;
        case EatFormatRgba16ui:     type.getQualifier().layoutFormat = ElfRgba16ui;     break;
        case EatFormatRgba8ui:      type.getQualifier().layoutFormat = ElfRgba8ui;      break;
        case EatFormatR32ui:        type.getQualifier().layoutFormat = ElfR32ui;        break;
        case EatFormatRgb10a2ui:    type.getQualifier().layoutFormat = ElfRgb10a2ui;    break;
        case EatFormatRg32ui:       type.getQualifier().layoutFormat = ElfRg32ui;       break;
        case EatFormatRg16ui:       type.getQualifier().layoutFormat = ElfRg16ui;       break;
        case EatFormatRg8ui:        type.getQualifier().layoutFormat = ElfRg8ui;        break;
        case EatFormatR16ui:        type.getQualifier().layoutFormat = ElfR16ui;        break;
        case EatFormatR8ui:         type.getQualifier().layoutFormat = ElfR8ui;         break;
        case EatFormatUnknown:      type.getQualifier().layoutFormat = ElfNone;         break;

        case EatNonWritable:  type.getQualifier().readonly = true;   break;
        case EatNonReadable:  type.getQualifier().writeonly = true;  break;

        default:
            if (! allowEntry)
                warn(loc, "attribute does not apply to a type", "", "");
            break;
        }
    }
}